

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_37(QPDF *pdf,char *arg2)

{
  bool bVar1;
  ParserCallbacks local_88;
  ParserCallbacks cb;
  QPDFPageObjectHelper *page;
  iterator __end1;
  iterator __begin1;
  QPDFPageDocumentHelper local_58;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_38 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_20;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  char *arg2_local;
  QPDF *pdf_local;
  
  __range1 = (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)arg2;
  arg2_local = (char *)pdf;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_58,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_58);
  local_20 = local_38;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_20)
  ;
  page = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_20);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&page);
    if (!bVar1) break;
    cb = (ParserCallbacks)
         __gnu_cxx::
         __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
         ::operator*(&__end1);
    ParserCallbacks::ParserCallbacks(&local_88);
    QPDFPageObjectHelper::parseContents((ParserCallbacks *)cb);
    ParserCallbacks::~ParserCallbacks(&local_88);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_38);
  return;
}

Assistant:

static void
test_37(QPDF& pdf, char const* arg2)
{
    // Parse content streams of all pages
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ParserCallbacks cb;
        page.parseContents(&cb);
    }
}